

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxAnalysis.h
# Opt level: O1

shared_ptr<const_calc4::Operator> __thiscall
calc4::LoadVariableToken::CreateOperator
          (LoadVariableToken *this,
          vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
          *operands,CompilationContext *context)

{
  shared_ptr<const_calc4::LoadVariableOperator> sVar1;
  shared_ptr<const_calc4::Operator> sVar2;
  Operator local_28;
  element_type *peStack_20;
  
  sVar1 = LoadVariableOperator::Create
                    ((LoadVariableOperator *)&stack0xffffffffffffffd8,(string *)(operands + 1));
  sVar2.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<const_calc4::LoadVariableOperator,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (this->super_Token).position.index = 0;
  (this->super_Token)._vptr_Token = local_28._vptr_Operator;
  (this->super_Token).position.index = (size_t)peStack_20;
  sVar2.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_calc4::Operator>)
         sVar2.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const Operator> CreateOperator(
        const std::vector<std::shared_ptr<const Operator>>& operands,
        CompilationContext& context) const override
    {
        return LoadVariableOperator::Create(supplementaryText);
    }